

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexTriangleKernel.h
# Opt level: O1

void __thiscall Ptex::v2_2::PtexTriangleKernel::reorient(PtexTriangleKernel *this,int eid,int aeid)

{
  float fVar1;
  float fVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  uint uVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  
  uVar17 = eid * 3 + aeid;
  if (8 < uVar17) {
    return;
  }
  fVar18 = this->u;
  fVar1 = this->v;
  fVar19 = 1.0 - fVar18;
  fVar20 = fVar19 - fVar1;
  switch(uVar17) {
  case 0:
    fVar18 = this->u1;
    fVar20 = this->v1;
    fVar2 = this->w1;
    this->u = fVar19;
    this->v = -fVar1;
    this->u1 = 1.0 - this->u2;
    this->v1 = -this->v2;
    this->w1 = 1.0 - this->w2;
    this->u2 = 1.0 - fVar18;
    this->v2 = -fVar20;
    this->w2 = 1.0 - fVar2;
    return;
  case 1:
    fVar2 = this->w1;
    fVar18 = this->u1;
    fVar1 = this->v1;
    this->u = 1.0 - fVar20;
    this->v = fVar19;
    this->u1 = 1.0 - this->w2;
    this->v1 = 1.0 - this->u2;
    this->w1 = -this->v2;
    this->u2 = 1.0 - fVar2;
    this->v2 = 1.0 - fVar18;
    this->w2 = -fVar1;
    break;
  case 2:
    fVar18 = this->u1;
    fVar19 = this->v1;
    fVar2 = this->w1;
    this->u = -fVar1;
    this->v = 1.0 - fVar20;
    this->u1 = -this->v2;
    this->v1 = 1.0 - this->w2;
    this->w1 = 1.0 - this->u2;
    this->u2 = -fVar19;
    this->v2 = 1.0 - fVar2;
    this->w2 = 1.0 - fVar18;
    goto LAB_005b8ba5;
  case 3:
    fVar18 = this->w1;
    fVar19 = this->u1;
    this->u = 1.0 - fVar1;
    this->v = -fVar20;
    this->u1 = 1.0 - this->v2;
    fVar1 = this->v1;
    this->v1 = -this->w2;
    this->w1 = 1.0 - this->u2;
    this->u2 = 1.0 - fVar1;
    this->v2 = -fVar18;
    fVar18 = this->A;
    this->w2 = 1.0 - fVar19;
    this->A = (this->C + fVar18) - this->B;
    this->B = (fVar18 + fVar18) - this->B;
    goto LAB_005b8bd1;
  case 4:
    fVar18 = this->w1;
    this->u = fVar19;
    this->w1 = -this->w2;
    uVar3 = this->u1;
    uVar10 = this->v1;
    this->v = 1.0 - fVar1;
    this->u1 = 1.0 - this->u2;
    this->v1 = 1.0 - this->v2;
    this->u2 = 1.0 - (float)uVar3;
    this->v2 = 1.0 - (float)uVar10;
    this->w2 = -fVar18;
    return;
  case 5:
    this->u = -fVar20;
    this->v = fVar19;
    uVar6 = this->u2;
    uVar13 = this->v2;
    this->u2 = -this->w1;
    uVar7 = this->u1;
    uVar14 = this->v1;
    this->u1 = -this->w2;
    this->v1 = 1.0 - (float)uVar6;
    this->w1 = 1.0 - (float)uVar13;
    this->v2 = 1.0 - (float)uVar7;
    this->w2 = 1.0 - (float)uVar14;
    break;
  case 6:
    fVar1 = this->u1;
    fVar19 = this->w1;
    fVar2 = this->v1;
    this->u = 1.0 - fVar20;
    this->v = -fVar18;
    this->u1 = 1.0 - this->w2;
    this->v1 = -this->u2;
    this->w1 = 1.0 - this->v2;
    this->u2 = 1.0 - fVar19;
    this->v2 = -fVar1;
    this->w2 = 1.0 - fVar2;
    break;
  case 7:
    fVar18 = this->u1;
    uVar4 = this->v2;
    uVar11 = this->w2;
    uVar5 = this->v1;
    uVar12 = this->w1;
    this->u = 1.0 - fVar1;
    this->v = 1.0 - fVar20;
    this->u1 = 1.0 - (float)uVar4;
    this->v1 = 1.0 - (float)uVar11;
    this->w1 = -this->u2;
    this->u2 = 1.0 - (float)uVar5;
    this->v2 = 1.0 - (float)uVar12;
    this->w2 = -fVar18;
LAB_005b8ba5:
    fVar18 = this->A;
    this->A = (this->C + fVar18) - this->B;
    this->B = (fVar18 + fVar18) - this->B;
LAB_005b8bd1:
    this->C = fVar18;
    return;
  case 8:
    fVar19 = this->u1;
    this->u = -fVar18;
    this->v = 1.0 - fVar1;
    this->u1 = -this->u2;
    uVar8 = this->v2;
    uVar15 = this->w2;
    this->u2 = -fVar19;
    uVar9 = this->v1;
    uVar16 = this->w1;
    this->v1 = 1.0 - (float)uVar8;
    this->w1 = 1.0 - (float)uVar15;
    this->v2 = 1.0 - (float)uVar9;
    this->w2 = 1.0 - (float)uVar16;
    return;
  }
  fVar18 = this->C;
  fVar1 = this->B;
  fVar19 = this->A;
  this->A = fVar18;
  this->B = (fVar18 + fVar18) - fVar1;
  this->C = (fVar19 + fVar18) - fVar1;
  return;
}

Assistant:

void reorient(int eid, int aeid)
    {
        float w = 1.0f-u-v;

#define C(eid, aeid) (eid*3 + aeid)
        switch (C(eid, aeid)) {
        case C(0, 0): set(1.0f-u, -v, 1.0f-u2, -v2, 1.0f-w2, 1.0f-u1, -v1, 1.0f-w1); break;
        case C(0, 1): set(1.0f-w, 1.0f-u, 1.0f-w2, 1.0f-u2, -v2, 1.0f-w1, 1.0f-u1, -v1); rotate1(); break;
        case C(0, 2): set( -v, 1.0f-w, -v2, 1.0f-w2, 1.0f-u2, -v1, 1.0f-w1, 1.0f-u1); rotate2(); break;

        case C(1, 0): set(1.0f-v, -w, 1.0f-v2, -w2, 1.0f-u2, 1.0f-v1, -w1, 1.0f-u1); rotate2(); break;
        case C(1, 1): set(1.0f-u, 1.0f-v, 1.0f-u2, 1.0f-v2, -w2, 1.0f-u1, 1.0f-v1, -w1); break;
        case C(1, 2): set( -w, 1.0f-u, -w2, 1.0f-u2, 1.0f-v2, -w1, 1.0f-u1, 1.0f-v1); rotate1(); break;

        case C(2, 0): set(1.0f-w, -u, 1.0f-w2, -u2, 1.0f-v2, 1.0f-w1, -u1, 1.0f-v1); rotate1(); break;
        case C(2, 1): set(1.0f-v, 1.0f-w, 1.0f-v2, 1.0f-w2, -u2, 1.0f-v1, 1.0f-w1, -u1); rotate2(); break;
        case C(2, 2): set( -u, 1.0f-v, -u2, 1.0f-v2, 1.0f-w2, -u1, 1.0f-v1, 1.0f-w1); break;
#undef C
        }
    }